

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O0

nodetree * NodeTree_ChildByName(void *p,tchar_t *Name,fourcc_t Class,bool_t Recursive)

{
  bool_t bVar1;
  tchar_t *a;
  nodetree *pnVar2;
  nodetree *j;
  tchar_t *s;
  nodetree *i;
  bool_t Recursive_local;
  fourcc_t Class_local;
  tchar_t *Name_local;
  void *p_local;
  
  if (((p != (void *)0x0) && (Name != (tchar_t *)0x0)) && (*Name != '\0')) {
    for (s = *(tchar_t **)((long)p + 0x30); s != (tchar_t *)0x0; s = *(tchar_t **)(s + 0x28)) {
      bVar1 = Node_IsPartOf(s,Class);
      if (((bVar1 != 0) && (a = (tchar_t *)Node_GetData((node *)s,5,4), a != (tchar_t *)0x0)) &&
         (bVar1 = tcsisame_ascii(a,Name), bVar1 != 0)) {
        return (nodetree *)s;
      }
      if (s == *(tchar_t **)(s + 0x28)) {
        __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                      ,0x5b,
                      "nodetree *NodeTree_ChildByName(const void *, const tchar_t *, fourcc_t, bool_t)"
                     );
      }
    }
    if (Recursive != 0) {
      for (s = *(tchar_t **)((long)p + 0x30); s != (tchar_t *)0x0; s = *(tchar_t **)(s + 0x28)) {
        pnVar2 = NodeTree_ChildByName(s,Name,Class,1);
        if (pnVar2 != (nodetree *)0x0) {
          return pnVar2;
        }
        if (s == *(tchar_t **)(s + 0x28)) {
          __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                        ,0x66,
                        "nodetree *NodeTree_ChildByName(const void *, const tchar_t *, fourcc_t, bool_t)"
                       );
        }
      }
    }
  }
  return (nodetree *)0x0;
}

Assistant:

nodetree* NodeTree_ChildByName(const void* p,const tchar_t* Name, fourcc_t Class, bool_t Recursive)
{
    if (p && Name && Name[0])
    {
        nodetree* i;
        for (i=NodeTree_Children(p);i;i=NodeTree_Next(i))
            if (Node_IsPartOf(i,Class))
            {
                const tchar_t* s = (const tchar_t*)Node_GetData((node*)i,NODE_ID,TYPE_STRING);
                if (s && tcsisame_ascii(s,Name))
                    return i;
            }

        if (Recursive)
        {
            nodetree* j;
            for (i=NodeTree_Children(p);i;i=NodeTree_Next(i))
                if ((j = NodeTree_ChildByName(i,Name,Class,1))!=NULL)
                    return j;
        }
    }
    return NULL;
}